

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

float * stbir__decode_uint8_linear_AR(float *decodep,int width_times_channels,void *inputp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint5 uVar3;
  float *pfVar4;
  byte *in_RDX;
  int in_ESI;
  float *in_RDI;
  bool bVar5;
  __m128i o0;
  __m128i i;
  uchar *end_input_m16;
  uchar *input;
  float *decode_end;
  float *decode;
  byte *local_250;
  float *local_240;
  __m128i zero;
  __m128 of3;
  __m128 of2;
  __m128 of1;
  __m128 of0;
  __m128i o3;
  __m128i o2;
  __m128i o1;
  
  pfVar4 = in_RDI + in_ESI;
  if (in_ESI < 0x10) {
    local_250 = in_RDX;
    for (local_240 = in_RDI + 4; local_240 <= pfVar4; local_240 = local_240 + 4) {
      local_240[-4] = (float)local_250[1];
      local_240[-3] = (float)*local_250;
      local_240[-2] = (float)local_250[3];
      local_240[-1] = (float)local_250[2];
      local_250 = local_250 + 4;
    }
    for (local_240 = local_240 + -4; local_240 < pfVar4; local_240 = local_240 + 2) {
      *local_240 = (float)local_250[1];
      local_240[1] = (float)*local_250;
      local_250 = local_250 + 2;
    }
  }
  else {
    local_250 = in_RDX;
    local_240 = in_RDI;
    do {
      do {
        uVar1 = *(undefined8 *)local_250;
        uVar2 = *(undefined8 *)(local_250 + 8);
        zero[1]._0_1_ = (byte)uVar1;
        zero[1]._1_1_ = (byte)((ulong)uVar1 >> 8);
        zero[1]._2_1_ = (byte)((ulong)uVar1 >> 0x10);
        zero[1]._3_1_ = (byte)((ulong)uVar1 >> 0x18);
        zero[1]._4_1_ = (byte)((ulong)uVar1 >> 0x20);
        zero[1]._5_1_ = (byte)((ulong)uVar1 >> 0x28);
        zero[1]._6_1_ = (byte)((ulong)uVar1 >> 0x30);
        zero[1]._7_1_ = (byte)((ulong)uVar1 >> 0x38);
        of1[0]._0_1_ = (byte)uVar2;
        of1[0]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
        of1[0]._2_1_ = (byte)((ulong)uVar2 >> 0x10);
        of1[0]._3_1_ = (byte)((ulong)uVar2 >> 0x18);
        of1[1]._0_1_ = (byte)((ulong)uVar2 >> 0x20);
        of1[1]._1_1_ = (undefined1)((ulong)uVar2 >> 0x28);
        of1[1]._2_1_ = (byte)((ulong)uVar2 >> 0x30);
        of1[1]._3_1_ = (byte)((ulong)uVar2 >> 0x38);
        o2[1]._5_3_ = 0;
        o2[1]._4_1_ = zero[1]._1_1_;
        o1[0]._5_3_ = 0;
        o1[0]._4_1_ = zero[1]._3_1_;
        o3[1]._5_3_ = 0;
        o3[1]._4_1_ = zero[1]._5_1_;
        o2[0]._5_3_ = 0;
        o2[0]._4_1_ = zero[1]._7_1_;
        uVar3 = CONCAT14(of1[0]._1_1_,(uint)CONCAT12(of1[0]._1_1_,(ushort)of1[0]._0_1_)) &
                0xff0000ffff;
        of0[2] = (float)uVar3;
        of0[3] = (float)(uint)(byte)(uVar3 >> 0x20);
        o3[0]._5_3_ = 0;
        o3[0]._4_1_ = of1[0]._3_1_;
        uVar3 = CONCAT14(of1[1]._1_1_,(uint)CONCAT12(of1[1]._1_1_,(ushort)of1[1]._0_1_)) &
                0xff0000ffff;
        of1[2] = (float)uVar3;
        of1[3] = (float)(uint)(byte)(uVar3 >> 0x20);
        of0[1] = (float)(uint)of1[1]._3_1_;
        *(ulong *)local_240 = CONCAT44((float)(byte)zero[1],(float)o2[1]._4_4_);
        *(ulong *)(local_240 + 2) = CONCAT44((float)zero[1]._2_1_,(float)o1[0]._4_4_);
        *(ulong *)(local_240 + 4) = CONCAT44((float)zero[1]._4_1_,(float)o3[1]._4_4_);
        *(ulong *)(local_240 + 6) = CONCAT44((float)zero[1]._6_1_,(float)o2[0]._4_4_);
        *(ulong *)(local_240 + 8) = CONCAT44((float)(int)of0[2],(float)(int)of0[3]);
        *(ulong *)(local_240 + 10) = CONCAT44((float)of1[0]._2_1_,(float)o3[0]._4_4_);
        *(ulong *)(local_240 + 0xc) = CONCAT44((float)(int)of1[2],(float)(int)of1[3]);
        *(ulong *)(local_240 + 0xe) = CONCAT44((float)of1[1]._2_1_,(float)(int)of0[1]);
        local_240 = local_240 + 0x10;
        local_250 = local_250 + 0x10;
      } while (local_240 <= pfVar4 + -0x10);
      bVar5 = local_240 != pfVar4;
      local_250 = in_RDX + (long)in_ESI + -0x10;
      local_240 = pfVar4 + -0x10;
    } while (bVar5);
  }
  return pfVar4;
}

Assistant:

static float * STBIR__CODER_NAME(stbir__decode_uint8_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const*)inputp;

  #ifdef STBIR_SIMD
  unsigned char const * end_input_m16 = input + width_times_channels - 16;
  if ( width_times_channels >= 16 )
  {
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o0,o1;
      stbir__simdf8 of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u8_to_u32( o0, o1, i );
      stbir__simdi8_convert_i32_to_float( of0, o0 );
      stbir__simdi8_convert_i32_to_float( of1, o1 );
      stbir__decode_simdf8_flip( of0 );
      stbir__decode_simdf8_flip( of1 );
      stbir__simdf8_store( decode + 0, of0 );
      stbir__simdf8_store( decode + 8, of1 );
      #else
      stbir__simdi i, o0, o1, o2, o3;
      stbir__simdf of0, of1, of2, of3;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u8_to_u32( o0,o1,o2,o3,i);
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdi_convert_i32_to_float( of2, o2 );
      stbir__simdi_convert_i32_to_float( of3, o3 );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__decode_simdf4_flip( of2 );
      stbir__decode_simdf4_flip( of3 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      stbir__simdf_store( decode + 8,  of2 );
      stbir__simdf_store( decode + 12, of3 );
#endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return decode_end + 16;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0]));
    decode[1-4] = ((float)(input[stbir__decode_order1]));
    decode[2-4] = ((float)(input[stbir__decode_order2]));
    decode[3-4] = ((float)(input[stbir__decode_order3]));
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0]));
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1]));
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2]));
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
  return decode_end;
}